

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O3

void __thiscall
jsonnet::internal::Apply::Apply
          (Apply *this,LocationRange *lr,Fodder *open_fodder,AST *target,Fodder *fodder_l,
          ArgParams *args,bool trailing_comma,Fodder *fodder_r,Fodder *tailstrict_fodder,
          bool tailstrict)

{
  AST::AST(&this->super_AST,lr,AST_APPLY,open_fodder);
  (this->super_AST)._vptr_AST = (_func_int **)&PTR__Apply_00242b00;
  this->target = target;
  std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
  vector(&this->fodderL,fodder_l);
  std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::vector
            (&this->args,args);
  this->trailingComma = trailing_comma;
  std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
  vector(&this->fodderR,fodder_r);
  std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
  vector(&this->tailstrictFodder,tailstrict_fodder);
  this->tailstrict = tailstrict;
  return;
}

Assistant:

Apply(const LocationRange &lr, const Fodder &open_fodder, AST *target, const Fodder &fodder_l,
          const ArgParams &args, bool trailing_comma, const Fodder &fodder_r,
          const Fodder &tailstrict_fodder, bool tailstrict)
        : AST(lr, AST_APPLY, open_fodder),
          target(target),
          fodderL(fodder_l),
          args(args),
          trailingComma(trailing_comma),
          fodderR(fodder_r),
          tailstrictFodder(tailstrict_fodder),
          tailstrict(tailstrict)
    {
    }